

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,string *rule,
          cmNinjaDeps *outputs,cmNinjaDeps *implicitOuts,cmNinjaDeps *explicitDeps,
          cmNinjaDeps *implicitDeps,cmNinjaDeps *orderOnlyDeps,cmNinjaVars *variables,
          string *rspfile,int cmdLineLimit,bool *usedResponseFile)

{
  string *psVar1;
  cmGlobalNinjaGenerator *pcVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  string *explicitDep;
  string *psVar6;
  char *pcVar7;
  cmGlobalNinjaGenerator *this_00;
  string *output;
  cmGlobalNinjaGenerator *path;
  allocator<char> local_292;
  allocator<char> local_291;
  string build;
  string local_260;
  string buildstr;
  string arguments;
  string assignments;
  string local_1c8;
  ostringstream variable_assignments;
  string local_1a0 [368];
  
  if (rule->_M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variable_assignments,"No rule for WriteBuildStatement! called with comment: ",
                   comment);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &variable_assignments);
  }
  else {
    if ((outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      WriteComment(os,comment);
      arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
      arguments._M_string_length = 0;
      arguments.field_2._M_local_buf[0] = '\0';
      psVar1 = (explicitDeps->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (psVar6 = (explicitDeps->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1;
          psVar6 = psVar6 + 1) {
        EncodePath(&build,(cmGlobalNinjaGenerator *)comment,psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &variable_assignments," ",&build);
        comment = (string *)&variable_assignments;
        std::__cxx11::string::append((string *)&arguments);
        std::__cxx11::string::~string((string *)&variable_assignments);
        std::__cxx11::string::~string((string *)&build);
      }
      if ((implicitDeps->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (implicitDeps->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar7 = " |";
        std::__cxx11::string::append((char *)&arguments);
        psVar1 = (implicitDeps->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (psVar6 = (implicitDeps->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1;
            psVar6 = psVar6 + 1) {
          EncodePath(&build,(cmGlobalNinjaGenerator *)pcVar7,psVar6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &variable_assignments," ",&build);
          pcVar7 = (char *)&variable_assignments;
          std::__cxx11::string::append((string *)&arguments);
          std::__cxx11::string::~string((string *)&variable_assignments);
          std::__cxx11::string::~string((string *)&build);
        }
      }
      if ((orderOnlyDeps->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (orderOnlyDeps->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar7 = " ||";
        std::__cxx11::string::append((char *)&arguments);
        psVar1 = (orderOnlyDeps->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (psVar6 = (orderOnlyDeps->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1;
            psVar6 = psVar6 + 1) {
          EncodePath(&build,(cmGlobalNinjaGenerator *)pcVar7,psVar6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &variable_assignments," ",&build);
          pcVar7 = (char *)&variable_assignments;
          std::__cxx11::string::append((string *)&arguments);
          std::__cxx11::string::~string((string *)&variable_assignments);
          std::__cxx11::string::~string((string *)&build);
        }
      }
      std::__cxx11::string::append((char *)&arguments);
      build._M_dataplus._M_p = (pointer)&build.field_2;
      build._M_string_length = 0;
      build.field_2._M_local_buf[0] = '\0';
      this_00 = (cmGlobalNinjaGenerator *)0x44f66a;
      std::__cxx11::string::append((char *)&build);
      pcVar2 = (cmGlobalNinjaGenerator *)
               (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (path = (cmGlobalNinjaGenerator *)
                  (outputs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; path != pcVar2;
          path = (cmGlobalNinjaGenerator *)
                 &(path->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.MakeSilentFlag.
                  field_2) {
        EncodePath(&buildstr,this_00,(string *)path);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &variable_assignments," ",&buildstr);
        this_00 = (cmGlobalNinjaGenerator *)&variable_assignments;
        std::__cxx11::string::append((string *)&build);
        std::__cxx11::string::~string((string *)&variable_assignments);
        std::__cxx11::string::~string((string *)&buildstr);
        if (this->ComputingUnknownDependencies == true) {
          this_00 = path;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->CombinedBuildOutputs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
        }
      }
      if ((implicitOuts->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (implicitOuts->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar7 = " |";
        std::__cxx11::string::append((char *)&build);
        psVar1 = (implicitOuts->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (psVar6 = (implicitOuts->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1;
            psVar6 = psVar6 + 1) {
          EncodePath(&buildstr,(cmGlobalNinjaGenerator *)pcVar7,psVar6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &variable_assignments," ",&buildstr);
          pcVar7 = (char *)&variable_assignments;
          std::__cxx11::string::append((string *)&build);
          std::__cxx11::string::~string((string *)&variable_assignments);
          std::__cxx11::string::~string((string *)&buildstr);
        }
      }
      std::__cxx11::string::append((char *)&build);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variable_assignments," ",rule);
      std::__cxx11::string::append((string *)&build);
      std::__cxx11::string::~string((string *)&variable_assignments);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable_assignments);
      for (p_Var4 = (variables->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(variables->_M_t)._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buildstr,"",(allocator<char> *)&assignments);
        WriteVariable((ostream *)&variable_assignments,(string *)(p_Var4 + 1),(string *)(p_Var4 + 2)
                      ,&buildstr,1);
        std::__cxx11::string::~string((string *)&buildstr);
      }
      std::__cxx11::string::string((string *)&buildstr,(string *)&build);
      std::__cxx11::stringbuf::str();
      if ((cmdLineLimit < 0) ||
         ((cmdLineLimit != 0 &&
          ((ulong)(uint)cmdLineLimit <
           arguments._M_string_length + buildstr._M_string_length + assignments._M_string_length +
           1000)))) {
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        local_260._M_string_length = 0;
        local_260.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"RSP_FILE",&local_291);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_292);
        WriteVariable((ostream *)&variable_assignments,&local_260,rspfile,&local_1c8,1);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)&assignments);
        std::__cxx11::string::~string((string *)&local_260);
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      if (usedResponseFile != (bool *)0x0) {
        *usedResponseFile = bVar3;
      }
      poVar5 = std::operator<<(os,(string *)&buildstr);
      poVar5 = std::operator<<(poVar5,(string *)&arguments);
      std::operator<<(poVar5,(string *)&assignments);
      std::__cxx11::string::~string((string *)&assignments);
      std::__cxx11::string::~string((string *)&buildstr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable_assignments);
      std::__cxx11::string::~string((string *)&build);
      psVar6 = &arguments;
      goto LAB_00288df2;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variable_assignments,
                   "No output files for WriteBuildStatement! called with comment: ",comment);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &variable_assignments);
  }
  psVar6 = (string *)&variable_assignments;
LAB_00288df2:
  std::__cxx11::string::~string((string *)psVar6);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuild(
  std::ostream& os, const std::string& comment, const std::string& rule,
  const cmNinjaDeps& outputs, const cmNinjaDeps& implicitOuts,
  const cmNinjaDeps& explicitDeps, const cmNinjaDeps& implicitDeps,
  const cmNinjaDeps& orderOnlyDeps, const cmNinjaVars& variables,
  const std::string& rspfile, int cmdLineLimit, bool* usedResponseFile)
{
  // Make sure there is a rule.
  if (rule.empty()) {
    cmSystemTools::Error("No rule for WriteBuildStatement! called "
                         "with comment: " +
                         comment);
    return;
  }

  // Make sure there is at least one output file.
  if (outputs.empty()) {
    cmSystemTools::Error("No output files for WriteBuildStatement! called "
                         "with comment: " +
                         comment);
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);

  std::string arguments;

  // TODO: Better formatting for when there are multiple input/output files.

  // Write explicit dependencies.
  for (std::string const& explicitDep : explicitDeps) {
    arguments += " " + EncodePath(explicitDep);
  }

  // Write implicit dependencies.
  if (!implicitDeps.empty()) {
    arguments += " |";
    for (std::string const& implicitDep : implicitDeps) {
      arguments += " " + EncodePath(implicitDep);
    }
  }

  // Write order-only dependencies.
  if (!orderOnlyDeps.empty()) {
    arguments += " ||";
    for (std::string const& orderOnlyDep : orderOnlyDeps) {
      arguments += " " + EncodePath(orderOnlyDep);
    }
  }

  arguments += "\n";

  std::string build;

  // Write outputs files.
  build += "build";
  for (std::string const& output : outputs) {
    build += " " + EncodePath(output);
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(output);
    }
  }
  if (!implicitOuts.empty()) {
    build += " |";
    for (std::string const& implicitOut : implicitOuts) {
      build += " " + EncodePath(implicitOut);
    }
  }
  build += ":";

  // Write the rule.
  build += " " + rule;

  // Write the variables bound to this build statement.
  std::ostringstream variable_assignments;
  for (auto const& variable : variables) {
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments, variable.first,
                                          variable.second, "", 1);
  }

  // check if a response file rule should be used
  std::string buildstr = build;
  std::string assignments = variable_assignments.str();
  bool useResponseFile = false;
  if (cmdLineLimit < 0 ||
      (cmdLineLimit > 0 &&
       (arguments.size() + buildstr.size() + assignments.size() + 1000) >
         static_cast<size_t>(cmdLineLimit))) {
    variable_assignments.str(std::string());
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments, "RSP_FILE",
                                          rspfile, "", 1);
    assignments += variable_assignments.str();
    useResponseFile = true;
  }
  if (usedResponseFile) {
    *usedResponseFile = useResponseFile;
  }

  os << buildstr << arguments << assignments;
}